

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformBlockTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  uint uVar2;
  deUint32 layoutFlags;
  TestContext *pTVar3;
  Context *pCVar4;
  BufferMode bufferMode;
  int extraout_EAX;
  TestNode *pTVar5;
  char *pcVar6;
  TestNode *node;
  Block2LevelStructArrayCase *pBVar7;
  long lVar8;
  anon_struct_16_2_f7718127 *paVar9;
  long lVar10;
  undefined8 in_R9;
  int iVar11;
  allocator<char> local_109;
  TestNode *local_108;
  anon_struct_16_2_f7718127 *local_100;
  anon_struct_16_2_f7718127 *local_f8;
  char *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string baseName;
  VarType parentType;
  VarType childType;
  VarType parentType_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "2_level_array","2-level basic array variable in single buffer");
  local_108 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  paVar9 = (anon_struct_16_2_f7718127 *)0x0;
  while( true ) {
    pTVar5 = (TestNode *)operator_new(0x70);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (paVar9 == (anon_struct_16_2_f7718127 *)0x3) break;
    local_100 = paVar9;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,pTVar3,init::layoutFlags[(long)paVar9].name,
               glcts::fixed_sample_locations_values + 1);
    local_f8 = init::layoutFlags + (long)paVar9;
    tcu::TestNode::addChild(local_108,pTVar5);
    pcVar6 = (char *)0x0;
    while (pcVar6 != (char *)0x19) {
      DVar1 = init::basicTypes[(long)pcVar6];
      local_f0 = pcVar6;
      pcVar6 = glu::getDataTypeName(DVar1);
      deqp::gls::ub::VarType::VarType((VarType *)&baseName,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2)
      ;
      deqp::gls::ub::VarType::VarType(&childType,(VarType *)&baseName,4);
      deqp::gls::ub::VarType::~VarType((VarType *)&baseName);
      deqp::gls::ub::VarType::VarType(&parentType,&childType,3);
      uVar2 = local_f8->flags;
      anon_unknown_1::createBlockBasicTypeCases
                ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,pcVar6,&parentType,
                 uVar2,(int)in_R9);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 0x10) {
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,*(char **)((long)&init::matrixFlags[0].name + lVar10),
                     (allocator<char> *)&parentType_1);
          std::operator+(&local_e8,&local_50,"_");
          std::operator+(&baseName,&local_e8,pcVar6);
          anon_unknown_1::createBlockBasicTypeCases
                    ((TestCaseGroup *)pTVar5,pCVar4,baseName._M_dataplus._M_p,&parentType,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar10) | uVar2,(int)in_R9);
          std::__cxx11::string::~string((string *)&baseName);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      deqp::gls::ub::VarType::~VarType(&parentType);
      deqp::gls::ub::VarType::~VarType(&childType);
      pcVar6 = local_f0 + 1;
    }
    paVar9 = (anon_struct_16_2_f7718127 *)((long)&local_100->name + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pTVar3,"3_level_array",
             "3-level basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  paVar9 = (anon_struct_16_2_f7718127 *)0x0;
  while( true ) {
    node = (TestNode *)operator_new(0x70);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    local_108 = node;
    if (paVar9 == (anon_struct_16_2_f7718127 *)0x3) break;
    local_100 = paVar9;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,pTVar3,init::layoutFlags[(long)paVar9].name,
               glcts::fixed_sample_locations_values + 1);
    local_f8 = init::layoutFlags + (long)paVar9;
    tcu::TestNode::addChild(pTVar5,node);
    pcVar6 = (char *)0x0;
    while (pcVar6 != (char *)0x19) {
      DVar1 = init::basicTypes[(long)pcVar6];
      local_f0 = pcVar6;
      pcVar6 = glu::getDataTypeName(DVar1);
      deqp::gls::ub::VarType::VarType((VarType *)&baseName,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2)
      ;
      deqp::gls::ub::VarType::VarType(&childType,(VarType *)&baseName,2);
      deqp::gls::ub::VarType::~VarType((VarType *)&baseName);
      deqp::gls::ub::VarType::VarType(&parentType,&childType,4);
      deqp::gls::ub::VarType::VarType(&parentType_1,&parentType,3);
      uVar2 = local_f8->flags;
      anon_unknown_1::createBlockBasicTypeCases
                ((TestCaseGroup *)local_108,(this->super_TestCaseGroup).m_context,pcVar6,
                 &parentType_1,uVar2,(int)in_R9);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 0x10) {
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,*(char **)((long)&init::matrixFlags[0].name + lVar10),
                     &local_109);
          std::operator+(&local_e8,&local_50,"_");
          std::operator+(&baseName,&local_e8,pcVar6);
          anon_unknown_1::createBlockBasicTypeCases
                    ((TestCaseGroup *)local_108,pCVar4,baseName._M_dataplus._M_p,&parentType_1,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar10) | uVar2,(int)in_R9);
          std::__cxx11::string::~string((string *)&baseName);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      deqp::gls::ub::VarType::~VarType(&parentType_1);
      deqp::gls::ub::VarType::~VarType(&parentType);
      deqp::gls::ub::VarType::~VarType(&childType);
      pcVar6 = local_f0 + 1;
    }
    paVar9 = (anon_struct_16_2_f7718127 *)((long)&local_100->name + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pTVar3,"2_level_struct_array","Struct array in one uniform block"
            );
  tcu::TestNode::addChild((TestNode *)this,node);
  lVar10 = 0;
  while( true ) {
    pTVar5 = (TestNode *)operator_new(0x70);
    pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar10 == 2) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,pTVar3,init::bufferModes[lVar10].name,
               glcts::fixed_sample_locations_values + 1);
    local_f8 = (anon_struct_16_2_f7718127 *)(init::bufferModes + lVar10);
    tcu::TestNode::addChild(local_108,pTVar5);
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      local_100 = init::layoutFlags + lVar8;
      local_f0 = init::layoutFlags[lVar8].name;
      for (iVar11 = 0; iVar11 != 2; iVar11 = iVar11 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseName,local_f0,(allocator<char> *)&local_e8);
        layoutFlags = local_f8->flags;
        if (layoutFlags != 0 || iVar11 != 0) {
          uVar2 = local_100->flags;
          if (iVar11 != 0) {
            std::__cxx11::string::append((char *)&baseName);
          }
          pBVar7 = (Block2LevelStructArrayCase *)operator_new(0xb8);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_e8,&baseName,"_vertex");
          bufferMode = (uint)(iVar11 != 0) * 3;
          anon_unknown_1::Block2LevelStructArrayCase::Block2LevelStructArrayCase
                    (pBVar7,pCVar4,local_e8._M_dataplus._M_p,(char *)(ulong)(uVar2 | 0x100),
                     layoutFlags,bufferMode,layoutFlags);
          tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
          std::__cxx11::string::~string((string *)&local_e8);
          pBVar7 = (Block2LevelStructArrayCase *)operator_new(0xb8);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_e8,&baseName,"_fragment");
          anon_unknown_1::Block2LevelStructArrayCase::Block2LevelStructArrayCase
                    (pBVar7,pCVar4,local_e8._M_dataplus._M_p,(char *)(ulong)(uVar2 | 0x200),
                     layoutFlags,bufferMode,layoutFlags);
          tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
          std::__cxx11::string::~string((string *)&local_e8);
          if ((uVar2 & 0x10) == 0) {
            pBVar7 = (Block2LevelStructArrayCase *)operator_new(0xb8);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_e8,&baseName,"_both");
            anon_unknown_1::Block2LevelStructArrayCase::Block2LevelStructArrayCase
                      (pBVar7,pCVar4,local_e8._M_dataplus._M_p,(char *)(ulong)(uVar2 | 0x300),
                       layoutFlags,bufferMode,layoutFlags);
            tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
            std::__cxx11::string::~string((string *)&local_e8);
          }
        }
        std::__cxx11::string::~string((string *)&baseName);
      }
    }
    lVar10 = lVar10 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pTVar3,"random","Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"basic_type_arrays",
             "Arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0xffc7,0x19,0x47e);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",BUFFERMODE_PER_BLOCK,0xffffffff,0x32,0x2bc0);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",BUFFERMODE_SINGLE,0xffffffff,0x32,0x2bf2);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init (void)
{
	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4,
		glu::TYPE_BOOL,
		glu::TYPE_BOOL_VEC2,
		glu::TYPE_BOOL_VEC3,
		glu::TYPE_BOOL_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} layoutFlags[] =
	{
		{ "shared",		LAYOUT_SHARED	},
		{ "packed",		LAYOUT_PACKED	},
		{ "std140",		LAYOUT_STD140	}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} matrixFlags[] =
	{
		{ "row_major",		LAYOUT_ROW_MAJOR	},
		{ "column_major",	LAYOUT_COLUMN_MAJOR }
	};

	static const struct
	{
		const char*							name;
		UniformBlockCase::BufferMode		mode;
	} bufferModes[] =
	{
		{ "per_block_buffer",	UniformBlockCase::BUFFERMODE_PER_BLOCK },
		{ "single_buffer",		UniformBlockCase::BUFFERMODE_SINGLE	}
	};

	// ubo.2_level_array
	{
		tcu::TestCaseGroup* nestedArrayGroup = new tcu::TestCaseGroup(m_testCtx, "2_level_array", "2-level basic array variable in single buffer");
		addChild(nestedArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			nestedArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				const glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*			typeName	= glu::getDataTypeName(type);
				const int			childSize	= 4;
				const int			parentSize	= 3;
				const VarType		childType	(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), childSize);
				const VarType		parentType	(childType, parentSize);

				createBlockBasicTypeCases(layoutGroup, m_context, typeName, parentType, layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  parentType, layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.3_level_array
	{
		tcu::TestCaseGroup* nestedArrayGroup = new tcu::TestCaseGroup(m_testCtx, "3_level_array", "3-level basic array variable in single buffer");
		addChild(nestedArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			nestedArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				const glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*			typeName	= glu::getDataTypeName(type);
				const int			childSize0	= 2;
				const int			childSize1	= 4;
				const int			parentSize	= 3;
				const VarType		childType0	(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), childSize0);
				const VarType		childType1	(childType0, childSize1);
				const VarType		parentType	(childType1, parentSize);

				createBlockBasicTypeCases(layoutGroup, m_context, typeName, parentType, layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  parentType, layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.2_level_struct_array
	{
		tcu::TestCaseGroup* structArrayArrayGroup = new tcu::TestCaseGroup(m_testCtx, "2_level_struct_array", "Struct array in one uniform block");
		addChild(structArrayArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			structArrayArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_both").c_str(),	"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32	allShaders		= FEATURE_VERTEX_BLOCKS|FEATURE_FRAGMENT_BLOCKS|FEATURE_SHARED_BLOCKS;
		const deUint32	allLayouts		= FEATURE_PACKED_LAYOUT|FEATURE_SHARED_LAYOUT|FEATURE_STD140_LAYOUT;
		const deUint32	allBasicTypes	= FEATURE_VECTORS|FEATURE_MATRICES;
		const deUint32	unused			= FEATURE_UNUSED_MEMBERS|FEATURE_UNUSED_UNIFORMS;
		const deUint32	matFlags		= FEATURE_MATRIX_LAYOUT;
		const deUint32	basicTypeArrays	= allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_ARRAYS|FEATURE_ARRAYS_OF_ARRAYS;
		const deUint32	allFeatures		= ~0u;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		createRandomCaseGroup(randomGroup, m_context, "basic_type_arrays",		"Arrays, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	basicTypeArrays,	25, 1150);
		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers",	"All random features, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allFeatures,		50, 11200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer",		"All random features, shared buffer",		UniformBlockCase::BUFFERMODE_SINGLE,	allFeatures,		50, 11250);
	}
}